

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
cppcms::application::add(application *this,application *app,string *name,string *url)

{
  url_mapper *this_00;
  application *in_RCX;
  char *in_RDX;
  char *in_RSI;
  application *in_RDI;
  ulong in_R8;
  void *in_R9;
  
  add(in_RCX,in_RDI);
  this_00 = mapper((application *)0x3b0a74);
  url_mapper::mount(this_00,in_RDX,(char *)in_RCX,in_RSI,in_R8,in_R9);
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url)
{
	add(app);
	mapper().mount(name,url,app);
}